

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::FlushLogFiles(int min_severity)

{
  int iVar1;
  LogDestination *this;
  ulong uVar2;
  ulong uVar3;
  MutexLock l;
  MutexLock local_30;
  
  uVar2 = (ulong)(uint)min_severity;
  local_30.mu_ = (Mutex *)log_mutex;
  if ((log_mutex[0x38] == '\x01') &&
     (iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex), iVar1 != 0)) {
    abort();
  }
  if (min_severity < 4) {
    uVar3 = 4;
    if (4 < (uint)min_severity) {
      uVar3 = (ulong)(uint)min_severity;
    }
    do {
      if (uVar3 == uVar2) {
        __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                      ,0x32d,
                      "static LogDestination *google::LogDestination::log_destination(LogSeverity)")
        ;
      }
      if ((&log_destinations_)[uVar2] == 0) {
        this = (LogDestination *)operator_new(0xe0);
        LogDestination(this,(LogSeverity)uVar2,(char *)0x0);
        (&log_destinations_)[uVar2] = this;
      }
      if ((&log_destinations_)[uVar2] != 0) {
        (**(code **)(**(long **)((&log_destinations_)[uVar2] + 0xd8) + 0x18))();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 4);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_30);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(i);
    if (log != NULL) {
      log->logger_->Flush();
    }
  }
}